

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.h
# Opt level: O0

void __thiscall
Eigen::internal::BlockImpl_dense<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true,_true>
::BlockImpl_dense(BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                  *this,Matrix<double,__1,__1,_0,__1,__1> *xpr,Index i)

{
  Scalar *pSVar1;
  Index IVar2;
  Index rows;
  Index i_local;
  Matrix<double,__1,__1,_0,__1,__1> *xpr_local;
  BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true> *this_local;
  
  pSVar1 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::data
                     (&xpr->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
  IVar2 = Matrix<double,_-1,_-1,_0,_-1,_-1>::outerStride(xpr);
  rows = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                   (&xpr->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
  MapBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_0>::MapBase
            (&this->
              super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
             ,pSVar1 + i * IVar2,rows,1);
  this->m_xpr = xpr;
  variable_if_dynamic<long,_-1>::variable_if_dynamic(&this->m_startRow,0);
  variable_if_dynamic<long,_-1>::variable_if_dynamic(&this->m_startCol,i);
  init(this,(EVP_PKEY_CTX *)i);
  return;
}

Assistant:

BlockImpl_dense(XprType& xpr, Index i)
      : Base(xpr.data() + i * (    ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && (!XprTypeIsRowMajor))
                                || ((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && ( XprTypeIsRowMajor)) ? xpr.innerStride() : xpr.outerStride()),
             BlockRows==1 ? 1 : xpr.rows(),
             BlockCols==1 ? 1 : xpr.cols()),
        m_xpr(xpr),
        m_startRow( (BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) ? i : 0),
        m_startCol( (BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) ? i : 0)
    {
      init();
    }